

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<TPZFlopCounter>::Add
          (TPZMatrix<TPZFlopCounter> *this,TPZMatrix<TPZFlopCounter> *A,
          TPZMatrix<TPZFlopCounter> *res)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZMatrix<TPZFlopCounter> *aBase;
  TPZMatrix<TPZFlopCounter> *this_01;
  TPZFlopCounter *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  char *unaff_retaddr;
  int64_t c;
  int64_t r;
  TPZFMatrix<TPZFlopCounter> *resFmat;
  TPZFMatrix<TPZFlopCounter> *aFmat;
  TPZFMatrix<TPZFlopCounter> *thisFmat;
  size_t in_stack_00000218;
  char *in_stack_00000220;
  TPZFlopCounter *pTVar6;
  TPZFlopCounter *this_02;
  long local_1c8;
  REAL local_48;
  long local_40;
  TPZFlopCounter *local_38;
  TPZMatrix<TPZFlopCounter> *local_30;
  long local_28;
  TPZMatrix<TPZFlopCounter> *local_20;
  TPZFlopCounter *local_18;
  TPZBaseMatrix *local_10;
  TPZBaseMatrix *msg2;
  TPZFMatrix<TPZFlopCounter> *this_00;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  msg2 = in_RDI;
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  iVar5 = TPZBaseMatrix::Rows(local_10);
  if (iVar4 == iVar5) {
    iVar4 = TPZBaseMatrix::Cols(in_RDI);
    iVar5 = TPZBaseMatrix::Cols(local_10);
    if (iVar4 == iVar5) goto LAB_01305799;
  }
  Error(unaff_retaddr,(char *)msg2);
LAB_01305799:
  iVar3 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  this_00 = (TPZFMatrix<TPZFlopCounter> *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  if (this_00 != (TPZFMatrix<TPZFlopCounter> *)CONCAT44(extraout_var_00,iVar3)) {
    std::operator<<((ostream *)&std::cerr,
                    "void TPZMatrix<TPZFlopCounter>::Add(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = TPZFlopCounter]"
                   );
    std::operator<<((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000220,in_stack_00000218);
  }
  (**(code **)((long)local_18->fVal + 0xf8))(local_18,in_RDI);
  if (in_RDI == (TPZBaseMatrix *)0x0) {
    aBase = (TPZMatrix<TPZFlopCounter> *)0x0;
  }
  else {
    aBase = (TPZMatrix<TPZFlopCounter> *)
            __dynamic_cast(in_RDI,&typeinfo,&TPZFMatrix<TPZFlopCounter>::typeinfo,0);
  }
  local_20 = aBase;
  if (local_10 == (TPZBaseMatrix *)0x0) {
    local_1c8 = 0;
  }
  else {
    local_1c8 = __dynamic_cast(local_10,&typeinfo,&TPZFMatrix<TPZFlopCounter>::typeinfo,0);
  }
  local_28 = local_1c8;
  if (local_18 == (TPZFlopCounter *)0x0) {
    this_01 = (TPZMatrix<TPZFlopCounter> *)0x0;
  }
  else {
    this_01 = (TPZMatrix<TPZFlopCounter> *)
              __dynamic_cast(local_18,&typeinfo,&TPZFMatrix<TPZFlopCounter>::typeinfo,0);
  }
  local_30 = this_01;
  if ((this_01 == (TPZMatrix<TPZFlopCounter> *)0x0) ||
     ((local_20 != (TPZMatrix<TPZFlopCounter> *)0x0 && (local_28 != 0)))) {
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4a])(in_RDI,local_18,local_10);
    Storage(this_01);
    Storage(this_01);
    TPZFMatrix<TPZFlopCounter>::operator+=(this_00,aBase);
    TPZFMatrixRef<TPZFlopCounter>::~TPZFMatrixRef((TPZFMatrixRef<TPZFlopCounter> *)0x1305ae4);
    TPZFMatrix<TPZFlopCounter>::~TPZFMatrix((TPZFMatrix<TPZFlopCounter> *)0x1305af1);
  }
  else {
    for (local_38 = (TPZFlopCounter *)0x0; pTVar6 = local_38, iVar4 = TPZBaseMatrix::Rows(in_RDI),
        (long)pTVar6 < iVar4; local_38 = (TPZFlopCounter *)((long)&local_38->fVal + 1)) {
      for (local_40 = 0; lVar1 = local_40, iVar4 = TPZBaseMatrix::Cols(in_RDI), lVar2 = local_40,
          lVar1 < iVar4; local_40 = local_40 + 1) {
        pTVar6 = local_18;
        this_02 = local_38;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_38,local_40);
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_38,local_40);
        local_48 = (REAL)TPZFlopCounter::operator+(this_02,pTVar6);
        (**(code **)((long)pTVar6->fVal + 0x118))(pTVar6,this_02,lVar2,&local_48);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Add(const TPZMatrix<TVar>&A,TPZMatrix<TVar>&res) const {
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix) <different dimensions>" );
	}
  if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)+A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() += A.Storage();
  }
  
}